

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O2

bool __thiscall
re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int iVar1;
  uint cond;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int i;
  ulong uVar6;
  long lVar7;
  int ncap;
  uint uVar8;
  size_type sVar9;
  byte *pbVar10;
  uint *puVar11;
  byte *p;
  uint uVar12;
  ulong uVar13;
  MatchKind local_254;
  StringPiece context;
  char *matchcap [10];
  LogMessage local_1b8;
  
  if (kind == kFullMatch || anchor == kAnchored) {
    local_254 = kFullMatch;
    uVar13 = (ulong)(uint)(nmatch * 2);
    if (nmatch * 2 < 3) {
      uVar13 = 2;
    }
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined8 *)(&local_1b8.flushed_ + uVar6 * 8) = 0;
    }
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      matchcap[uVar6] = (char *)0x0;
    }
    context.data_ = const_context->data_;
    context.size_ = const_context->size_;
    if (context.data_ == (const_pointer)0x0) {
      context.data_ = text->data_;
      context.size_ = text->size_;
    }
    p = (byte *)text->data_;
    if ((this->anchor_start_ != true) || ((byte *)context.data_ == p)) {
      if (this->anchor_end_ == false) {
        sVar9 = text->size_;
        local_254 = kind;
      }
      else {
        sVar9 = text->size_;
        if ((byte *)(context.data_ + context.size_) != p + sVar9) {
          return false;
        }
      }
      puVar2 = (uint *)(this->onepass_nodes_).ptr_._M_t.
                       super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      iVar1 = this->bytemap_range_;
      pbVar10 = p + sVar9;
      matchcap[0] = (char *)p;
      bVar4 = false;
      puVar11 = puVar2;
      uVar12 = *puVar2;
      for (; ncap = (int)uVar13, p < pbVar10; p = p + 1) {
        cond = puVar11[(ulong)this->bytemap_[*p] + 1];
        if (((cond & 0x3f) == 0) || (bVar5 = Satisfy(cond,&context,(char *)p), bVar5)) {
          lVar7 = (long)(int)((cond >> 0x10) * (iVar1 * 4 + 4));
          puVar11 = (uint *)((long)puVar2 + lVar7);
          uVar8 = *(uint *)((long)puVar2 + lVar7);
        }
        else {
          puVar11 = (uint *)0x0;
          uVar8 = 0x30;
        }
        if ((((local_254 != kFullMatch) && (uVar12 != 0x30)) &&
            ((uVar8 & 0x3f) != 0 || (cond & 0x40) != 0)) &&
           (((uVar12 & 0x3f) == 0 || (bVar5 = Satisfy(uVar12,&context,(char *)p), bVar5)))) {
          for (uVar6 = 2; uVar13 != uVar6; uVar6 = uVar6 + 1) {
            matchcap[uVar6] = *(char **)(&local_1b8.flushed_ + uVar6 * 8);
          }
          if ((1 < nmatch) && ((uVar12 & 0x7f80) != 0)) {
            ApplyCaptures(uVar12,(char *)p,matchcap,ncap);
          }
          matchcap[1] = (char *)p;
          bVar4 = true;
          if ((local_254 == kFirstMatch) && (bVar4 = true, (cond & 0x40) != 0)) goto LAB_001b45b2;
        }
        if (puVar11 == (uint *)0x0) goto LAB_001b4592;
        if ((1 < nmatch) && ((cond & 0x7f80) != 0)) {
          ApplyCaptures(cond,(char *)p,(char **)&local_1b8,ncap);
        }
        uVar12 = uVar8;
      }
      uVar12 = *puVar11;
      if ((uVar12 == 0x30) ||
         (((uVar12 & 0x3f) != 0 && (bVar5 = Satisfy(uVar12,&context,(char *)p), !bVar5)))) {
LAB_001b4592:
        if (!bVar4) {
          return false;
        }
      }
      else {
        if ((1 < nmatch) && ((uVar12 & 0x7f80) != 0)) {
          ApplyCaptures(uVar12,(char *)p,(char **)&local_1b8,ncap);
        }
        for (uVar6 = 2; uVar13 != uVar6; uVar6 = uVar6 + 1) {
          matchcap[uVar6] = *(char **)(&local_1b8.flushed_ + uVar6 * 8);
        }
        matchcap[1] = (char *)p;
      }
LAB_001b45b2:
      uVar6 = 0;
      uVar13 = (ulong)(uint)nmatch;
      if (nmatch < 1) {
        uVar13 = uVar6;
      }
      for (; uVar13 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
        lVar7 = *(long *)((long)matchcap + uVar6);
        lVar3 = *(long *)((long)matchcap + uVar6 + 8);
        *(long *)((long)&match->data_ + uVar6) = lVar7;
        *(long *)((long)&match->size_ + uVar6) = lVar3 - lVar7;
      }
      return true;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/onepass.cc"
               ,0xdb);
    std::operator<<((ostream *)&local_1b8.str_,"Cannot use SearchOnePass for unanchored matches.");
    LogMessage::~LogMessage(&local_1b8);
  }
  return false;
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  if (anchor_start() && context.begin() != text.begin())
    return false;
  if (anchor_end() && context.end() != text.end())
    return false;
  if (anchor_end())
    kind = kFullMatch;

  uint8_t* nodes = onepass_nodes_.data();
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  // start() is always mapped to the zeroth OneState.
  OneState* state = IndexToNode(nodes, statesize, 0);
  uint8_t* bytemap = bytemap_;
  const char* bp = text.data();
  const char* ep = text.data() + text.size();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32_t nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32_t matchcond = nextmatchcond;
    uint32_t cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32_t nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32_t matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i] =
        StringPiece(matchcap[2 * i],
                    static_cast<size_t>(matchcap[2 * i + 1] - matchcap[2 * i]));
  return true;
}